

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMesh2.c
# Opt level: O3

int Bmc_MeshAddOneHotness2(sat_solver *pSat,int iFirst,int iLast)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  undefined1 *puVar9;
  ulong uVar10;
  int pLits [2];
  int pVars [100];
  int local_1e0;
  int local_1dc;
  ulong local_1d8;
  ulong local_1d0;
  int iStack_1c8;
  undefined1 local_1c4 [404];
  
  if ((iLast <= iFirst) || (iFirst + 0x6e <= iLast)) {
    __assert_fail("iFirst < iLast && iFirst + 110 > iLast",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                  ,0x4d,"int Bmc_MeshAddOneHotness2(sat_solver *, int, int)");
  }
  uVar5 = (ulong)(uint)iFirst;
  uVar8 = 0;
  do {
    if ((iFirst < 0) || (pSat->size <= (int)uVar5)) {
      __assert_fail("v >= 0 && v < s->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0xda,"int sat_solver_var_value(sat_solver *, int)");
    }
    if (pSat->model[uVar5] == 1) {
      if (99 < (int)uVar8) {
        __assert_fail("nVars < 100",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                      ,0x51,"int Bmc_MeshAddOneHotness2(sat_solver *, int, int)");
      }
      lVar7 = (long)(int)uVar8;
      uVar8 = uVar8 + 1;
      *(int *)(local_1c4 + lVar7 * 4 + -4) = (int)uVar5;
    }
    uVar5 = uVar5 + 1;
  } while ((int)uVar5 < iLast);
  iVar3 = 0;
  if (1 < (int)uVar8) {
    uVar10 = (ulong)uVar8;
    puVar9 = local_1c4;
    iVar3 = 0;
    uVar6 = 0;
    uVar5 = uVar10;
    local_1d8 = uVar10;
    do {
      uVar5 = uVar5 - 1;
      local_1d0 = uVar6 + 1;
      if (local_1d0 < uVar10) {
        iVar2 = *(int *)(local_1c4 + uVar6 * 4 + -4);
        iVar1 = iVar2 * 2 + 1;
        uVar10 = 0;
        do {
          if (iVar2 < 0) {
LAB_005bbc18:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          local_1e0 = iVar1;
          if (*(int *)(puVar9 + uVar10 * 4) < 0) goto LAB_005bbc18;
          local_1dc = *(int *)(puVar9 + uVar10 * 4) * 2 + 1;
          iVar4 = sat_solver_addclause(pSat,&local_1e0,(lit *)&local_1d8);
          if (iVar4 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                          ,0x5c,"int Bmc_MeshAddOneHotness2(sat_solver *, int, int)");
          }
          uVar10 = uVar10 + 1;
        } while (uVar5 != uVar10);
        iVar3 = iVar3 + (int)uVar10;
        uVar10 = local_1d8;
      }
      puVar9 = puVar9 + 4;
      uVar6 = local_1d0;
    } while (local_1d0 != uVar10);
  }
  return iVar3;
}

Assistant:

int Bmc_MeshAddOneHotness2( sat_solver * pSat, int iFirst, int iLast )
{
    int i, j, v, pVars[100], nVars  = 0, nCount = 0;
    assert( iFirst < iLast && iFirst + 110 > iLast );
    for ( v = iFirst; v < iLast; v++ )
        if ( Bmc_MeshVarValue2(pSat, v) ) // v = 1
        {
            assert( nVars < 100 );
            pVars[ nVars++ ] = v;
        }
    if ( nVars <= 1 )
        return 0;
    for ( i = 0;   i < nVars; i++ )
    for ( j = i+1; j < nVars; j++ )
    {
        int pLits[2], RetValue;
        pLits[0] = Abc_Var2Lit( pVars[i], 1 );
        pLits[1] = Abc_Var2Lit( pVars[j], 1 );
        RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );  assert( RetValue );
        nCount++;
    }
    return nCount;
}